

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

bool __thiscall
pybind11::detail::type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
          (type_caster_generic *this,handle src,bool convert)

{
  _func__object_ptr__object_ptr__typeobject_ptr *p_Var1;
  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> *this_00;
  PyTypeObject *pPVar2;
  bool bVar3;
  int iVar4;
  PyObject **ppPVar5;
  size_type sVar6;
  const_reference pptVar7;
  reference pptVar8;
  vector<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
  *this_01;
  _object *ptr;
  uint local_12c;
  handle local_100;
  object local_f8;
  reference local_f0;
  _func__object_ptr__object_ptr__typeobject_ptr **converter;
  const_iterator __end4;
  const_iterator __begin4;
  vector<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
  *__range4;
  value_and_holder local_c8;
  type_info *local_a8;
  type_info *base;
  const_iterator __end7;
  const_iterator __begin7;
  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> *__range7;
  byte local_61;
  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> *pvStack_60;
  bool no_cpp_mi;
  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> *bases;
  PyTypeObject *local_38;
  PyTypeObject *srctype;
  type_caster_generic *this_;
  type_caster_generic *ptStack_20;
  bool convert_local;
  type_caster_generic *this_local;
  handle src_local;
  
  this_._7_1_ = convert;
  ptStack_20 = this;
  this_local = (type_caster_generic *)src.m_ptr;
  bVar3 = handle::operator_cast_to_bool((handle *)&this_local);
  if ((bVar3) && (this->typeinfo != (type_info *)0x0)) {
    bVar3 = object_api<pybind11::handle>::is_none((object_api<pybind11::handle> *)&this_local);
    if (bVar3) {
      if ((this_._7_1_ & 1) == 0) {
        src_local.m_ptr._7_1_ = false;
      }
      else {
        this->value = (void *)0x0;
        src_local.m_ptr._7_1_ = true;
      }
    }
    else {
      srctype = (PyTypeObject *)this;
      check_holder_compat(this);
      ppPVar5 = handle::ptr((handle *)&this_local);
      pPVar2 = srctype;
      local_38 = (*ppPVar5)->ob_type;
      if (local_38 == this->typeinfo->type) {
        ppPVar5 = handle::ptr((handle *)&this_local);
        instance::get_value_and_holder
                  ((value_and_holder *)&bases,(instance *)*ppPVar5,(type_info *)0x0);
        load_value((type_caster_generic *)pPVar2,(value_and_holder *)&bases);
        src_local.m_ptr._7_1_ = true;
      }
      else {
        iVar4 = PyType_IsSubtype(local_38,this->typeinfo->type);
        if (iVar4 != 0) {
          pvStack_60 = all_type_info(local_38);
          local_61 = this->typeinfo->field_0x80 & 1;
          sVar6 = std::
                  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                  ::size(pvStack_60);
          if ((sVar6 == 1) &&
             (((local_61 & 1) != 0 ||
              (pptVar7 = std::
                         vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                         ::front(pvStack_60), (*pptVar7)->type == this->typeinfo->type)))) {
            pPVar2 = srctype;
            ppPVar5 = handle::ptr((handle *)&this_local);
            instance::get_value_and_holder
                      ((value_and_holder *)&__range7,(instance *)*ppPVar5,(type_info *)0x0);
            load_value((type_caster_generic *)pPVar2,(value_and_holder *)&__range7);
            return true;
          }
          sVar6 = std::
                  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                  ::size(pvStack_60);
          this_00 = pvStack_60;
          if (1 < sVar6) {
            __end7 = std::
                     vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                     ::begin(pvStack_60);
            base = (type_info *)
                   std::
                   vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
                   ::end(this_00);
            while (bVar3 = __gnu_cxx::operator!=
                                     (&__end7,(__normal_iterator<pybind11::detail::type_info_*const_*,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>
                                               *)&base), bVar3) {
              pptVar8 = __gnu_cxx::
                        __normal_iterator<pybind11::detail::type_info_*const_*,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>
                        ::operator*(&__end7);
              local_a8 = *pptVar8;
              if ((local_61 & 1) == 0) {
                local_12c = (uint)(local_a8->type == this->typeinfo->type);
              }
              else {
                local_12c = PyType_IsSubtype(local_a8->type,this->typeinfo->type);
              }
              pPVar2 = srctype;
              if (local_12c != 0) {
                ppPVar5 = handle::ptr((handle *)&this_local);
                instance::get_value_and_holder(&local_c8,(instance *)*ppPVar5,local_a8);
                load_value((type_caster_generic *)pPVar2,&local_c8);
                return true;
              }
              __gnu_cxx::
              __normal_iterator<pybind11::detail::type_info_*const_*,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>
              ::operator++(&__end7);
            }
          }
          bVar3 = try_implicit_casts((type_caster_generic *)srctype,(handle)this_local,
                                     (bool)(this_._7_1_ & 1));
          if (bVar3) {
            return true;
          }
        }
        if ((this_._7_1_ & 1) != 0) {
          this_01 = &this->typeinfo->implicit_conversions;
          __end4 = std::
                   vector<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
                   ::begin(this_01);
          converter = (_func__object_ptr__object_ptr__typeobject_ptr **)
                      std::
                      vector<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
                      ::end(this_01);
          while (bVar3 = __gnu_cxx::operator!=
                                   (&__end4,(__normal_iterator<_object_*(*const_*)(_object_*,__typeobject_*),_std::vector<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>_>
                                             *)&converter), bVar3) {
            local_f0 = __gnu_cxx::
                       __normal_iterator<_object_*(*const_*)(_object_*,__typeobject_*),_std::vector<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>_>
                       ::operator*(&__end4);
            p_Var1 = *local_f0;
            ppPVar5 = handle::ptr((handle *)&this_local);
            ptr = (*p_Var1)(*ppPVar5,this->typeinfo->type);
            handle::handle(&local_100,ptr);
            reinterpret_steal<pybind11::object>((pybind11 *)&local_f8,local_100);
            object::operator=(&this->temp,&local_f8);
            object::~object(&local_f8);
            bVar3 = load_impl<pybind11::detail::type_caster_generic>
                              (this,(this->temp).super_handle.m_ptr,false);
            if (bVar3) {
              return true;
            }
            __gnu_cxx::
            __normal_iterator<_object_*(*const_*)(_object_*,__typeobject_*),_std::vector<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>_>
            ::operator++(&__end4);
          }
          bVar3 = try_direct_conversions((type_caster_generic *)srctype,(handle)this_local);
          if (bVar3) {
            return true;
          }
        }
        src_local.m_ptr._7_1_ = false;
      }
    }
  }
  else {
    src_local.m_ptr._7_1_ = false;
  }
  return src_local.m_ptr._7_1_;
}

Assistant:

PYBIND11_NOINLINE bool load_impl(handle src, bool convert) {
        if (!src || !typeinfo)
            return false;
        if (src.is_none()) {
            // Defer accepting None to other overloads (if we aren't in convert mode):
            if (!convert) return false;
            value = nullptr;
            return true;
        }

        auto &this_ = static_cast<ThisT &>(*this);
        this_.check_holder_compat();

        PyTypeObject *srctype = Py_TYPE(src.ptr());

        // Case 1: If src is an exact type match for the target type then we can reinterpret_cast
        // the instance's value pointer to the target type:
        if (srctype == typeinfo->type) {
            this_.load_value(reinterpret_cast<instance *>(src.ptr())->get_value_and_holder());
            return true;
        }
        // Case 2: We have a derived class
        else if (PyType_IsSubtype(srctype, typeinfo->type)) {
            auto &bases = all_type_info(srctype);
            bool no_cpp_mi = typeinfo->simple_type;

            // Case 2a: the python type is a Python-inherited derived class that inherits from just
            // one simple (no MI) pybind11 class, or is an exact match, so the C++ instance is of
            // the right type and we can use reinterpret_cast.
            // (This is essentially the same as case 2b, but because not using multiple inheritance
            // is extremely common, we handle it specially to avoid the loop iterator and type
            // pointer lookup overhead)
            if (bases.size() == 1 && (no_cpp_mi || bases.front()->type == typeinfo->type)) {
                this_.load_value(reinterpret_cast<instance *>(src.ptr())->get_value_and_holder());
                return true;
            }
            // Case 2b: the python type inherits from multiple C++ bases.  Check the bases to see if
            // we can find an exact match (or, for a simple C++ type, an inherited match); if so, we
            // can safely reinterpret_cast to the relevant pointer.
            else if (bases.size() > 1) {
                for (auto base : bases) {
                    if (no_cpp_mi ? PyType_IsSubtype(base->type, typeinfo->type) : base->type == typeinfo->type) {
                        this_.load_value(reinterpret_cast<instance *>(src.ptr())->get_value_and_holder(base));
                        return true;
                    }
                }
            }

            // Case 2c: C++ multiple inheritance is involved and we couldn't find an exact type match
            // in the registered bases, above, so try implicit casting (needed for proper C++ casting
            // when MI is involved).
            if (this_.try_implicit_casts(src, convert))
                return true;
        }

        // Perform an implicit conversion
        if (convert) {
            for (auto &converter : typeinfo->implicit_conversions) {
                temp = reinterpret_steal<object>(converter(src.ptr(), typeinfo->type));
                if (load_impl<ThisT>(temp, false))
                    return true;
            }
            if (this_.try_direct_conversions(src))
                return true;
        }
        return false;
    }